

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::ConstantNamePrefix
                   (string *__return_storage_ptr__,string *classname)

{
  bool bVar1;
  allocator local_81;
  undefined4 local_80;
  allocator local_79;
  int local_78;
  int local_74;
  int i_1;
  int i;
  char *local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined1 local_40 [8];
  string lower;
  bool is_reserved;
  string *classname_local;
  
  lower.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_40,(string *)classname);
  local_48._M_current = (char *)std::__cxx11::string::begin();
  local_50._M_current = (char *)std::__cxx11::string::end();
  local_58 = (char *)std::__cxx11::string::begin();
  _i_1 = std::
         transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                   (local_48,local_50,
                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     )local_58,tolower);
  for (local_74 = 0; local_74 < 0x4d; local_74 = local_74 + 1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,kReservedNames[local_74]);
    if (bVar1) {
      lower.field_2._M_local_buf[0xf] = '\x01';
      break;
    }
  }
  local_78 = 0;
  do {
    if (8 < local_78) {
LAB_004c80c1:
      if ((lower.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_81);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"PB",&local_79);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
      }
      local_80 = 1;
      std::__cxx11::string::~string((string *)local_40);
      return __return_storage_ptr__;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,kValidConstantNames[local_78]);
    if (bVar1) {
      lower.field_2._M_local_buf[0xf] = '\0';
      goto LAB_004c80c1;
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

std::string ConstantNamePrefix(const std::string& classname) {
  bool is_reserved = false;

  std::string lower = classname;
  std::transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  for (int i = 0; i < kValidConstantNamesSize; i++) {
    if (lower == kValidConstantNames[i]) {
      is_reserved = false;
      break;
    }
  }

  if (is_reserved) {
    return "PB";
  }

  return "";
}